

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

obj * add_to_magic_chest(obj *obj)

{
  int iVar1;
  obj *local_20;
  obj *otmp;
  obj *obj_local;
  
  otmp = obj;
  if (obj->where != '\0') {
    panic("add_to_magic_chest: obj not free (%d,%d,%d)",(ulong)(uint)(int)obj->where,
          (ulong)(uint)(int)obj->otyp,(ulong)(uint)(int)obj->invlet);
  }
  local_20 = magic_chest_objs;
  while( true ) {
    if (local_20 == (obj *)0x0) {
      otmp->where = '\a';
      otmp->nobj = magic_chest_objs;
      magic_chest_objs = otmp;
      return otmp;
    }
    iVar1 = merged(&local_20,&otmp);
    if (iVar1 != 0) break;
    local_20 = local_20->nobj;
  }
  return local_20;
}

Assistant:

static struct obj *add_to_magic_chest(struct obj *obj)
{
    struct obj *otmp;

    if (obj->where != OBJ_FREE) {
	panic("add_to_magic_chest: obj not free (%d,%d,%d)",
	      obj->where, obj->otyp, obj->invlet);
    }

    /* merge if possible */
    for (otmp = magic_chest_objs; otmp; otmp = otmp->nobj)
	if (merged(&otmp, &obj)) return otmp;

    obj->where = OBJ_MAGIC_CHEST;
    obj->nobj = magic_chest_objs;
    magic_chest_objs = obj;
    return obj;
}